

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream,bool is_lazy)

{
  pointer puVar1;
  segment *psVar2;
  elfio *peVar3;
  pointer puVar4;
  section sVar5;
  pointer puVar6;
  istream *piVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *psec;
  pointer puVar14;
  ulong uVar15;
  ulong uVar16;
  ushort local_8e;
  byte local_8b;
  ushort local_8a;
  segment_impl<ELFIO::Elf64_Phdr> *local_88;
  uint local_7c;
  address_translator *local_78;
  endianness_convertor *local_70;
  vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
  *local_68;
  ulong local_60;
  ulong local_58;
  istream *local_50;
  elfio *local_48;
  ulong local_40;
  long local_38;
  undefined4 extraout_var_04;
  
  uVar9 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[4])()
  ;
  uVar10 = (*((this->header)._M_t.
              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t
              .super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
              super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[9])
                     ();
  iVar11 = (*((this->header)._M_t.
              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t
              .super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
              super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
             [0x1c])();
  iVar12 = (*((this->header)._M_t.
              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t
              .super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
              super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
             [0x1e])();
  local_38 = CONCAT44(extraout_var,iVar12);
  local_8a = (ushort)iVar11;
  local_8b = (byte)uVar9;
  if ((((ushort)uVar10 < 0x38 && local_8b == 2) && local_8a != 0) ||
     (local_40 = (ulong)(uVar10 & 0xffff), ((ushort)uVar10 < 0x20 && local_8b == 1) && local_8a != 0
     )) {
LAB_00106d82:
    bVar8 = false;
  }
  else {
    local_8e = 0;
    if (local_8a != 0) {
      local_68 = (vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
                  *)&this->segments_;
      local_70 = &this->convertor;
      local_78 = &this->addr_translator;
      local_7c = (uint)is_lazy;
      local_50 = stream;
      local_48 = this;
      do {
        peVar3 = local_48;
        piVar7 = local_50;
        if ((char)uVar9 != '\x02') {
          if ((char)uVar9 == '\x01') {
            local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)
                       operator_new(0x78,(nothrow_t *)&std::nothrow);
            if (local_88 != (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
              (local_88->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_0010dca0;
              local_88->pstream = (istream *)0x0;
              (local_88->ph).p_type = 0;
              (local_88->ph).p_flags = 0;
              (local_88->ph).p_offset = 0;
              (local_88->ph).p_vaddr = 0;
              *(undefined8 *)((long)&(local_88->ph).p_vaddr + 2) = 0;
              *(undefined8 *)((long)&(local_88->ph).p_paddr + 2) = 0;
              (local_88->ph).p_memsz = 0;
              (local_88->ph).p_align = 0;
              *(undefined8 *)&local_88->index = 0;
              (local_88->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
              (local_88->sections).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_70;
              (local_88->sections).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_78;
              (local_88->sections).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined4 *)
               ((long)&(local_88->sections).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7) = 0;
            }
            std::
            vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
            ::emplace_back<ELFIO::segment_impl<ELFIO::Elf32_Phdr>*>
                      (local_68,(segment_impl<ELFIO::Elf32_Phdr> **)&local_88);
            goto LAB_00106ba1;
          }
LAB_00106d5e:
          puVar6 = (peVar3->segments_).
                   super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar1 = puVar6 + -1;
          (peVar3->segments_).
          super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar1;
          psVar2 = puVar6[-1]._M_t.
                   super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
                   super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                   super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
          if (psVar2 != (segment *)0x0) {
            (*psVar2->_vptr_segment[1])();
          }
          (puVar1->_M_t).super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>
          ._M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
          super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl = (segment *)0x0;
          goto LAB_00106d82;
        }
        local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)operator_new(0x90,(nothrow_t *)&std::nothrow);
        if (local_88 != (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
          (local_88->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_0010db78;
          local_88->pstream = (istream *)0x0;
          (local_88->ph).p_type = 0;
          (local_88->ph).p_flags = 0;
          (local_88->ph).p_offset = 0;
          (local_88->ph).p_vaddr = 0;
          (local_88->ph).p_paddr = 0;
          (local_88->ph).p_filesz = 0;
          (local_88->ph).p_memsz = 0;
          (local_88->ph).p_align = 0;
          local_88->index = 0;
          (local_88->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
          (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88->convertor = local_70;
          local_88->translator = local_78;
          local_88->stream_size = 0;
          *(undefined4 *)((long)&local_88->stream_size + 7) = 0;
        }
        std::
        vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
        ::emplace_back<ELFIO::segment_impl<ELFIO::Elf64_Phdr>*>(local_68,&local_88);
LAB_00106ba1:
        psVar2 = (peVar3->segments_).
                 super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
                 super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                 super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
        iVar11 = (*psVar2->_vptr_segment[0x1c])
                           (psVar2,piVar7,local_8e * local_40 + local_38,0,(ulong)local_7c);
        if (((char)iVar11 == '\0') ||
           (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0)) goto LAB_00106d5e;
        (*psVar2->_vptr_segment[0x1a])(psVar2,&local_8e);
        iVar11 = (*psVar2->_vptr_segment[0x11])(psVar2);
        local_58 = CONCAT44(extraout_var_00,iVar11);
        iVar11 = (*psVar2->_vptr_segment[0xd])(psVar2);
        iVar12 = (*psVar2->_vptr_segment[9])(psVar2);
        local_60 = CONCAT44(extraout_var_02,iVar12);
        iVar12 = (*psVar2->_vptr_segment[0xf])(psVar2);
        peVar3 = (peVar3->sections).parent;
        puVar14 = (peVar3->sections_).
                  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (peVar3->sections_).
                 super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar14 != puVar4) {
          uVar16 = CONCAT44(extraout_var_01,iVar11) + local_58;
          uVar15 = CONCAT44(extraout_var_03,iVar12) + local_60;
          do {
            uVar9 = (*((puVar14->_M_t).
                       super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                       .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section
                      [7])();
            sVar5._vptr_section =
                 ((puVar14->_M_t).
                  super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                  super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                  super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section;
            if ((uVar9 & 2) == 0) {
              iVar11 = (*sVar5._vptr_section[0x17])();
              uVar13 = CONCAT44(extraout_var_04,iVar11);
              iVar11 = (*((puVar14->_M_t).
                          super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                          .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                         _vptr_section[0x13])();
              if (((uVar13 < uVar16) && (local_58 <= uVar13)) &&
                 (CONCAT44(extraout_var_05,iVar11) + uVar13 <= uVar16)) {
LAB_00106ccd:
                iVar11 = (*psVar2->_vptr_segment[3])(psVar2);
                if (((iVar11 != 7) ||
                    (uVar9 = (*((puVar14->_M_t).
                                super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                               _vptr_section[7])(), (uVar9 >> 10 & 1) != 0)) &&
                   ((uVar9 = (*((puVar14->_M_t).
                                super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                               _vptr_section[7])(), (uVar9 >> 10 & 1) == 0 ||
                    (iVar11 = (*psVar2->_vptr_segment[3])(psVar2), iVar11 == 7)))) {
                  uVar9 = (*((puVar14->_M_t).
                             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                             .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                            _vptr_section[2])();
                  (*psVar2->_vptr_segment[0x15])(psVar2,(ulong)(uVar9 & 0xffff),0);
                }
              }
            }
            else {
              iVar11 = (*sVar5._vptr_section[0x11])();
              uVar13 = CONCAT44(extraout_var_06,iVar11);
              iVar11 = (*((puVar14->_M_t).
                          super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                          .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                         _vptr_section[0x13])();
              if (((uVar13 < uVar15) && (local_60 <= uVar13)) &&
                 (CONCAT44(extraout_var_07,iVar11) + uVar13 <= uVar15)) goto LAB_00106ccd;
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar4);
        }
        local_8e = local_8e + 1;
        uVar9 = (uint)local_8b;
      } while (local_8e < local_8a);
    }
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool load_segments( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_segment_entry_size();
        Elf_Half      num        = header->get_segments_num();
        Elf64_Off     offset     = header->get_segments_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Phdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Phdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            if ( file_class == ELFCLASS64 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf64_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else if ( file_class == ELFCLASS32 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf32_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else {
                segments_.pop_back();
                return false;
            }

            segment* seg = segments_.back().get();

            if ( !seg->load( stream,
                             static_cast<std::streamoff>( offset ) +
                                 static_cast<std::streampos>( i ) * entry_size,
                             is_lazy ) ||
                 stream.fail() ) {
                segments_.pop_back();
                return false;
            }

            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr  = seg->get_virtual_address();
            Elf64_Off segVEndAddr   = segVBaseAddr + seg->get_memory_size();
            for ( const auto& psec : sections ) {
                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if ( ( ( psec->get_flags() & SHF_ALLOC ) == SHF_ALLOC )
                         ? is_sect_in_seg( psec->get_address(),
                                           psec->get_size(), segVBaseAddr,
                                           segVEndAddr )
                         : is_sect_in_seg( psec->get_offset(), psec->get_size(),
                                           segBaseOffset, segEndOffset ) ) {

                    // If it is a TLS segment, add TLS sections only and vice versa
                    if ( ( ( seg->get_type() == PT_TLS ) &&
                           ( ( psec->get_flags() & SHF_TLS ) != SHF_TLS ) ) ||
                         ( ( ( psec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                           ( seg->get_type() != PT_TLS ) ) )
                        continue;

                    // Alignment of segment shall not be updated, to preserve original value
                    // It will be re-calculated on saving.
                    seg->add_section_index( psec->get_index(), 0 );
                }
            }
        }

        return true;
    }